

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageCracker.h
# Opt level: O2

void __thiscall
FIX50::MessageCracker::crack(MessageCracker *this,Message *message,SessionID *sessionID)

{
  bool bVar1;
  FieldBase *pFVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  string *__lhs;
  
  pFVar2 = FIX::FieldMap::getFieldRef((FieldMap *)&message->field_0x70,0x23);
  __lhs = &pFVar2->m_string;
  bVar1 = std::operator==(__lhs,"6");
  if (bVar1) {
    UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[4];
  }
  else {
    bVar1 = std::operator==(__lhs,"7");
    if (bVar1) {
      UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[5];
    }
    else {
      bVar1 = std::operator==(__lhs,"8");
      if (bVar1) {
        UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[6];
      }
      else {
        bVar1 = std::operator==(__lhs,"9");
        if (bVar1) {
          UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[7];
        }
        else {
          bVar1 = std::operator==(__lhs,"B");
          if (bVar1) {
            UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[8];
          }
          else {
            bVar1 = std::operator==(__lhs,"C");
            if (bVar1) {
              UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[9];
            }
            else {
              bVar1 = std::operator==(__lhs,"D");
              if (bVar1) {
                UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[10];
              }
              else {
                bVar1 = std::operator==(__lhs,"E");
                if (bVar1) {
                  UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0xb];
                }
                else {
                  bVar1 = std::operator==(__lhs,"F");
                  if (bVar1) {
                    UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0xc];
                  }
                  else {
                    bVar1 = std::operator==(__lhs,"G");
                    if (bVar1) {
                      UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0xd];
                    }
                    else {
                      bVar1 = std::operator==(__lhs,"H");
                      if (bVar1) {
                        UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0xe];
                      }
                      else {
                        bVar1 = std::operator==(__lhs,"J");
                        if (bVar1) {
                          UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0xf];
                        }
                        else {
                          bVar1 = std::operator==(__lhs,"K");
                          if (bVar1) {
                            UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0x10];
                          }
                          else {
                            bVar1 = std::operator==(__lhs,"L");
                            if (bVar1) {
                              UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0x11];
                            }
                            else {
                              bVar1 = std::operator==(__lhs,"M");
                              if (bVar1) {
                                UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0x12];
                              }
                              else {
                                bVar1 = std::operator==(__lhs,"N");
                                if (bVar1) {
                                  UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0x13];
                                }
                                else {
                                  bVar1 = std::operator==(__lhs,"P");
                                  if (bVar1) {
                                    UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0x14];
                                  }
                                  else {
                                    bVar1 = std::operator==(__lhs,"Q");
                                    if (bVar1) {
                                      UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0x15];
                                    }
                                    else {
                                      bVar1 = std::operator==(__lhs,"R");
                                      if (bVar1) {
                                        UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0x16];
                                      }
                                      else {
                                        bVar1 = std::operator==(__lhs,"S");
                                        if (bVar1) {
                                          UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0x17];
                                        }
                                        else {
                                          bVar1 = std::operator==(__lhs,"T");
                                          if (bVar1) {
                                            UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0x18]
                                            ;
                                          }
                                          else {
                                            bVar1 = std::operator==(__lhs,"V");
                                            if (bVar1) {
                                              UNRECOVERED_JUMPTABLE =
                                                   this->_vptr_MessageCracker[0x19];
                                            }
                                            else {
                                              bVar1 = std::operator==(__lhs,"W");
                                              if (bVar1) {
                                                UNRECOVERED_JUMPTABLE =
                                                     this->_vptr_MessageCracker[0x1a];
                                              }
                                              else {
                                                bVar1 = std::operator==(__lhs,"X");
                                                if (bVar1) {
                                                  UNRECOVERED_JUMPTABLE =
                                                       this->_vptr_MessageCracker[0x1b];
                                                }
                                                else {
                                                  bVar1 = std::operator==(__lhs,"Y");
                                                  if (bVar1) {
                                                    UNRECOVERED_JUMPTABLE =
                                                         this->_vptr_MessageCracker[0x1c];
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(__lhs,"Z");
                                                    if (bVar1) {
                                                      UNRECOVERED_JUMPTABLE =
                                                           this->_vptr_MessageCracker[0x1d];
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(__lhs,"a");
                                                      if (bVar1) {
                                                        UNRECOVERED_JUMPTABLE =
                                                             this->_vptr_MessageCracker[0x1e];
                                                      }
                                                      else {
                                                        bVar1 = std::operator==(__lhs,"b");
                                                        if (bVar1) {
                                                          UNRECOVERED_JUMPTABLE =
                                                               this->_vptr_MessageCracker[0x1f];
                                                        }
                                                        else {
                                                          bVar1 = std::operator==(__lhs,"c");
                                                          if (bVar1) {
                                                            UNRECOVERED_JUMPTABLE =
                                                                 this->_vptr_MessageCracker[0x20];
                                                          }
                                                          else {
                                                            bVar1 = std::operator==(__lhs,"d");
                                                            if (bVar1) {
                                                              UNRECOVERED_JUMPTABLE =
                                                                   this->_vptr_MessageCracker[0x21];
                                                            }
                                                            else {
                                                              bVar1 = std::operator==(__lhs,"e");
                                                              if (bVar1) {
                                                                UNRECOVERED_JUMPTABLE =
                                                                     this->_vptr_MessageCracker
                                                                     [0x22];
                                                              }
                                                              else {
                                                                bVar1 = std::operator==(__lhs,"f");
                                                                if (bVar1) {
                                                                  UNRECOVERED_JUMPTABLE =
                                                                       this->_vptr_MessageCracker
                                                                       [0x23];
                                                                }
                                                                else {
                                                                  bVar1 = std::operator==(__lhs,"g")
                                                                  ;
                                                                  if (bVar1) {
                                                                    UNRECOVERED_JUMPTABLE =
                                                                         this->_vptr_MessageCracker
                                                                         [0x24];
                                                                  }
                                                                  else {
                                                                    bVar1 = std::operator==(__lhs,
                                                  "h");
                                                  if (bVar1) {
                                                    UNRECOVERED_JUMPTABLE =
                                                         this->_vptr_MessageCracker[0x25];
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(__lhs,"i");
                                                    if (bVar1) {
                                                      UNRECOVERED_JUMPTABLE =
                                                           this->_vptr_MessageCracker[0x26];
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(__lhs,"j");
                                                      if (bVar1) {
                                                        UNRECOVERED_JUMPTABLE =
                                                             this->_vptr_MessageCracker[0x27];
                                                      }
                                                      else {
                                                        bVar1 = std::operator==(__lhs,"k");
                                                        if (bVar1) {
                                                          UNRECOVERED_JUMPTABLE =
                                                               this->_vptr_MessageCracker[0x28];
                                                        }
                                                        else {
                                                          bVar1 = std::operator==(__lhs,"l");
                                                          if (bVar1) {
                                                            UNRECOVERED_JUMPTABLE =
                                                                 this->_vptr_MessageCracker[0x29];
                                                          }
                                                          else {
                                                            bVar1 = std::operator==(__lhs,"m");
                                                            if (bVar1) {
                                                              UNRECOVERED_JUMPTABLE =
                                                                   this->_vptr_MessageCracker[0x2a];
                                                            }
                                                            else {
                                                              bVar1 = std::operator==(__lhs,"o");
                                                              if (bVar1) {
                                                                UNRECOVERED_JUMPTABLE =
                                                                     this->_vptr_MessageCracker
                                                                     [0x2b];
                                                              }
                                                              else {
                                                                bVar1 = std::operator==(__lhs,"p");
                                                                if (bVar1) {
                                                                  UNRECOVERED_JUMPTABLE =
                                                                       this->_vptr_MessageCracker
                                                                       [0x2c];
                                                                }
                                                                else {
                                                                  bVar1 = std::operator==(__lhs,"q")
                                                                  ;
                                                                  if (bVar1) {
                                                                    UNRECOVERED_JUMPTABLE =
                                                                         this->_vptr_MessageCracker
                                                                         [0x2d];
                                                                  }
                                                                  else {
                                                                    bVar1 = std::operator==(__lhs,
                                                  "r");
                                                  if (bVar1) {
                                                    UNRECOVERED_JUMPTABLE =
                                                         this->_vptr_MessageCracker[0x2e];
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(__lhs,"s");
                                                    if (bVar1) {
                                                      UNRECOVERED_JUMPTABLE =
                                                           this->_vptr_MessageCracker[0x2f];
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(__lhs,"t");
                                                      if (bVar1) {
                                                        UNRECOVERED_JUMPTABLE =
                                                             this->_vptr_MessageCracker[0x30];
                                                      }
                                                      else {
                                                        bVar1 = std::operator==(__lhs,"u");
                                                        if (bVar1) {
                                                          UNRECOVERED_JUMPTABLE =
                                                               this->_vptr_MessageCracker[0x31];
                                                        }
                                                        else {
                                                          bVar1 = std::operator==(__lhs,"v");
                                                          if (bVar1) {
                                                            UNRECOVERED_JUMPTABLE =
                                                                 this->_vptr_MessageCracker[0x32];
                                                          }
                                                          else {
                                                            bVar1 = std::operator==(__lhs,"w");
                                                            if (bVar1) {
                                                              UNRECOVERED_JUMPTABLE =
                                                                   this->_vptr_MessageCracker[0x33];
                                                            }
                                                            else {
                                                              bVar1 = std::operator==(__lhs,"x");
                                                              if (bVar1) {
                                                                UNRECOVERED_JUMPTABLE =
                                                                     this->_vptr_MessageCracker
                                                                     [0x34];
                                                              }
                                                              else {
                                                                bVar1 = std::operator==(__lhs,"y");
                                                                if (bVar1) {
                                                                  UNRECOVERED_JUMPTABLE =
                                                                       this->_vptr_MessageCracker
                                                                       [0x35];
                                                                }
                                                                else {
                                                                  bVar1 = std::operator==(__lhs,"z")
                                                                  ;
                                                                  if (bVar1) {
                                                                    UNRECOVERED_JUMPTABLE =
                                                                         this->_vptr_MessageCracker
                                                                         [0x36];
                                                                  }
                                                                  else {
                                                                    bVar1 = std::operator==(__lhs,
                                                  "AA");
                                                  if (bVar1) {
                                                    UNRECOVERED_JUMPTABLE =
                                                         this->_vptr_MessageCracker[0x37];
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(__lhs,"AB");
                                                    if (bVar1) {
                                                      UNRECOVERED_JUMPTABLE =
                                                           this->_vptr_MessageCracker[0x38];
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(__lhs,"AC");
                                                      if (bVar1) {
                                                        UNRECOVERED_JUMPTABLE =
                                                             this->_vptr_MessageCracker[0x39];
                                                      }
                                                      else {
                                                        bVar1 = std::operator==(__lhs,"AD");
                                                        if (bVar1) {
                                                          UNRECOVERED_JUMPTABLE =
                                                               this->_vptr_MessageCracker[0x3a];
                                                        }
                                                        else {
                                                          bVar1 = std::operator==(__lhs,"AE");
                                                          if (bVar1) {
                                                            UNRECOVERED_JUMPTABLE =
                                                                 this->_vptr_MessageCracker[0x3b];
                                                          }
                                                          else {
                                                            bVar1 = std::operator==(__lhs,"AF");
                                                            if (bVar1) {
                                                              UNRECOVERED_JUMPTABLE =
                                                                   this->_vptr_MessageCracker[0x3c];
                                                            }
                                                            else {
                                                              bVar1 = std::operator==(__lhs,"AG");
                                                              if (bVar1) {
                                                                UNRECOVERED_JUMPTABLE =
                                                                     this->_vptr_MessageCracker
                                                                     [0x3d];
                                                              }
                                                              else {
                                                                bVar1 = std::operator==(__lhs,"AH");
                                                                if (bVar1) {
                                                                  UNRECOVERED_JUMPTABLE =
                                                                       this->_vptr_MessageCracker
                                                                       [0x3e];
                                                                }
                                                                else {
                                                                  bVar1 = std::operator==(__lhs,"AI"
                                                                                         );
                                                                  if (bVar1) {
                                                                    UNRECOVERED_JUMPTABLE =
                                                                         this->_vptr_MessageCracker
                                                                         [0x3f];
                                                                  }
                                                                  else {
                                                                    bVar1 = std::operator==(__lhs,
                                                  "AJ");
                                                  if (bVar1) {
                                                    UNRECOVERED_JUMPTABLE =
                                                         this->_vptr_MessageCracker[0x40];
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(__lhs,"AK");
                                                    if (bVar1) {
                                                      UNRECOVERED_JUMPTABLE =
                                                           this->_vptr_MessageCracker[0x41];
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(__lhs,"AL");
                                                      if (bVar1) {
                                                        UNRECOVERED_JUMPTABLE =
                                                             this->_vptr_MessageCracker[0x42];
                                                      }
                                                      else {
                                                        bVar1 = std::operator==(__lhs,"AM");
                                                        if (bVar1) {
                                                          UNRECOVERED_JUMPTABLE =
                                                               this->_vptr_MessageCracker[0x43];
                                                        }
                                                        else {
                                                          bVar1 = std::operator==(__lhs,"AN");
                                                          if (bVar1) {
                                                            UNRECOVERED_JUMPTABLE =
                                                                 this->_vptr_MessageCracker[0x44];
                                                          }
                                                          else {
                                                            bVar1 = std::operator==(__lhs,"AO");
                                                            if (bVar1) {
                                                              UNRECOVERED_JUMPTABLE =
                                                                   this->_vptr_MessageCracker[0x45];
                                                            }
                                                            else {
                                                              bVar1 = std::operator==(__lhs,"AP");
                                                              if (bVar1) {
                                                                UNRECOVERED_JUMPTABLE =
                                                                     this->_vptr_MessageCracker
                                                                     [0x46];
                                                              }
                                                              else {
                                                                bVar1 = std::operator==(__lhs,"AQ");
                                                                if (bVar1) {
                                                                  UNRECOVERED_JUMPTABLE =
                                                                       this->_vptr_MessageCracker
                                                                       [0x47];
                                                                }
                                                                else {
                                                                  bVar1 = std::operator==(__lhs,"AR"
                                                                                         );
                                                                  if (bVar1) {
                                                                    UNRECOVERED_JUMPTABLE =
                                                                         this->_vptr_MessageCracker
                                                                         [0x48];
                                                                  }
                                                                  else {
                                                                    bVar1 = std::operator==(__lhs,
                                                  "AS");
                                                  if (bVar1) {
                                                    UNRECOVERED_JUMPTABLE =
                                                         this->_vptr_MessageCracker[0x49];
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(__lhs,"AT");
                                                    if (bVar1) {
                                                      UNRECOVERED_JUMPTABLE =
                                                           this->_vptr_MessageCracker[0x4a];
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(__lhs,"AU");
                                                      if (bVar1) {
                                                        UNRECOVERED_JUMPTABLE =
                                                             this->_vptr_MessageCracker[0x4b];
                                                      }
                                                      else {
                                                        bVar1 = std::operator==(__lhs,"AV");
                                                        if (bVar1) {
                                                          UNRECOVERED_JUMPTABLE =
                                                               this->_vptr_MessageCracker[0x4c];
                                                        }
                                                        else {
                                                          bVar1 = std::operator==(__lhs,"AW");
                                                          if (bVar1) {
                                                            UNRECOVERED_JUMPTABLE =
                                                                 this->_vptr_MessageCracker[0x4d];
                                                          }
                                                          else {
                                                            bVar1 = std::operator==(__lhs,"AX");
                                                            if (bVar1) {
                                                              UNRECOVERED_JUMPTABLE =
                                                                   this->_vptr_MessageCracker[0x4e];
                                                            }
                                                            else {
                                                              bVar1 = std::operator==(__lhs,"AY");
                                                              if (bVar1) {
                                                                UNRECOVERED_JUMPTABLE =
                                                                     this->_vptr_MessageCracker
                                                                     [0x4f];
                                                              }
                                                              else {
                                                                bVar1 = std::operator==(__lhs,"AZ");
                                                                if (bVar1) {
                                                                  UNRECOVERED_JUMPTABLE =
                                                                       this->_vptr_MessageCracker
                                                                       [0x50];
                                                                }
                                                                else {
                                                                  bVar1 = std::operator==(__lhs,"BA"
                                                                                         );
                                                                  if (bVar1) {
                                                                    UNRECOVERED_JUMPTABLE =
                                                                         this->_vptr_MessageCracker
                                                                         [0x51];
                                                                  }
                                                                  else {
                                                                    bVar1 = std::operator==(__lhs,
                                                  "BB");
                                                  if (bVar1) {
                                                    UNRECOVERED_JUMPTABLE =
                                                         this->_vptr_MessageCracker[0x52];
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(__lhs,"BC");
                                                    if (bVar1) {
                                                      UNRECOVERED_JUMPTABLE =
                                                           this->_vptr_MessageCracker[0x53];
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(__lhs,"BD");
                                                      if (bVar1) {
                                                        UNRECOVERED_JUMPTABLE =
                                                             this->_vptr_MessageCracker[0x54];
                                                      }
                                                      else {
                                                        bVar1 = std::operator==(__lhs,"BE");
                                                        if (bVar1) {
                                                          UNRECOVERED_JUMPTABLE =
                                                               this->_vptr_MessageCracker[0x55];
                                                        }
                                                        else {
                                                          bVar1 = std::operator==(__lhs,"BF");
                                                          if (bVar1) {
                                                            UNRECOVERED_JUMPTABLE =
                                                                 this->_vptr_MessageCracker[0x56];
                                                          }
                                                          else {
                                                            bVar1 = std::operator==(__lhs,"BG");
                                                            if (bVar1) {
                                                              UNRECOVERED_JUMPTABLE =
                                                                   this->_vptr_MessageCracker[0x57];
                                                            }
                                                            else {
                                                              bVar1 = std::operator==(__lhs,"BH");
                                                              if (bVar1) {
                                                                UNRECOVERED_JUMPTABLE =
                                                                     this->_vptr_MessageCracker
                                                                     [0x58];
                                                              }
                                                              else {
                                                                bVar1 = std::operator==(__lhs,"BO");
                                                                if (bVar1) {
                                                                  UNRECOVERED_JUMPTABLE =
                                                                       this->_vptr_MessageCracker
                                                                       [0x59];
                                                                }
                                                                else {
                                                                  bVar1 = std::operator==(__lhs,"BP"
                                                                                         );
                                                                  if (bVar1) {
                                                                    UNRECOVERED_JUMPTABLE =
                                                                         this->_vptr_MessageCracker
                                                                         [0x5a];
                                                                  }
                                                                  else {
                                                                    bVar1 = std::operator==(__lhs,
                                                  "BK");
                                                  if (bVar1) {
                                                    UNRECOVERED_JUMPTABLE =
                                                         this->_vptr_MessageCracker[0x5b];
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(__lhs,"BL");
                                                    if (bVar1) {
                                                      UNRECOVERED_JUMPTABLE =
                                                           this->_vptr_MessageCracker[0x5c];
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(__lhs,"BM");
                                                      if (bVar1) {
                                                        UNRECOVERED_JUMPTABLE =
                                                             this->_vptr_MessageCracker[0x5d];
                                                      }
                                                      else {
                                                        bVar1 = std::operator==(__lhs,"BN");
                                                        if (bVar1) {
                                                          UNRECOVERED_JUMPTABLE =
                                                               this->_vptr_MessageCracker[0x5e];
                                                        }
                                                        else {
                                                          bVar1 = std::operator==(__lhs,"BJ");
                                                          if (bVar1) {
                                                            UNRECOVERED_JUMPTABLE =
                                                                 this->_vptr_MessageCracker[0x5f];
                                                          }
                                                          else {
                                                            bVar1 = std::operator==(__lhs,"BI");
                                                            if (bVar1) {
                                                              UNRECOVERED_JUMPTABLE =
                                                                   this->_vptr_MessageCracker[0x60];
                                                            }
                                                            else {
                                                              UNRECOVERED_JUMPTABLE =
                                                                   this->_vptr_MessageCracker[2];
                                                            }
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  (*UNRECOVERED_JUMPTABLE)(this,message,sessionID);
  return;
}

Assistant:

void crack( const Message& message, 
              const FIX::SessionID& sessionID )
  {
    const std::string& msgTypeValue 
      = message.getHeader().getField( FIX::FIELD::MsgType );
    
    if( msgTypeValue == "6" )
      onMessage( (const IOI&)message, sessionID );
    else
    if( msgTypeValue == "7" )
      onMessage( (const Advertisement&)message, sessionID );
    else
    if( msgTypeValue == "8" )
      onMessage( (const ExecutionReport&)message, sessionID );
    else
    if( msgTypeValue == "9" )
      onMessage( (const OrderCancelReject&)message, sessionID );
    else
    if( msgTypeValue == "B" )
      onMessage( (const News&)message, sessionID );
    else
    if( msgTypeValue == "C" )
      onMessage( (const Email&)message, sessionID );
    else
    if( msgTypeValue == "D" )
      onMessage( (const NewOrderSingle&)message, sessionID );
    else
    if( msgTypeValue == "E" )
      onMessage( (const NewOrderList&)message, sessionID );
    else
    if( msgTypeValue == "F" )
      onMessage( (const OrderCancelRequest&)message, sessionID );
    else
    if( msgTypeValue == "G" )
      onMessage( (const OrderCancelReplaceRequest&)message, sessionID );
    else
    if( msgTypeValue == "H" )
      onMessage( (const OrderStatusRequest&)message, sessionID );
    else
    if( msgTypeValue == "J" )
      onMessage( (const AllocationInstruction&)message, sessionID );
    else
    if( msgTypeValue == "K" )
      onMessage( (const ListCancelRequest&)message, sessionID );
    else
    if( msgTypeValue == "L" )
      onMessage( (const ListExecute&)message, sessionID );
    else
    if( msgTypeValue == "M" )
      onMessage( (const ListStatusRequest&)message, sessionID );
    else
    if( msgTypeValue == "N" )
      onMessage( (const ListStatus&)message, sessionID );
    else
    if( msgTypeValue == "P" )
      onMessage( (const AllocationInstructionAck&)message, sessionID );
    else
    if( msgTypeValue == "Q" )
      onMessage( (const DontKnowTrade&)message, sessionID );
    else
    if( msgTypeValue == "R" )
      onMessage( (const QuoteRequest&)message, sessionID );
    else
    if( msgTypeValue == "S" )
      onMessage( (const Quote&)message, sessionID );
    else
    if( msgTypeValue == "T" )
      onMessage( (const SettlementInstructions&)message, sessionID );
    else
    if( msgTypeValue == "V" )
      onMessage( (const MarketDataRequest&)message, sessionID );
    else
    if( msgTypeValue == "W" )
      onMessage( (const MarketDataSnapshotFullRefresh&)message, sessionID );
    else
    if( msgTypeValue == "X" )
      onMessage( (const MarketDataIncrementalRefresh&)message, sessionID );
    else
    if( msgTypeValue == "Y" )
      onMessage( (const MarketDataRequestReject&)message, sessionID );
    else
    if( msgTypeValue == "Z" )
      onMessage( (const QuoteCancel&)message, sessionID );
    else
    if( msgTypeValue == "a" )
      onMessage( (const QuoteStatusRequest&)message, sessionID );
    else
    if( msgTypeValue == "b" )
      onMessage( (const MassQuoteAcknowledgement&)message, sessionID );
    else
    if( msgTypeValue == "c" )
      onMessage( (const SecurityDefinitionRequest&)message, sessionID );
    else
    if( msgTypeValue == "d" )
      onMessage( (const SecurityDefinition&)message, sessionID );
    else
    if( msgTypeValue == "e" )
      onMessage( (const SecurityStatusRequest&)message, sessionID );
    else
    if( msgTypeValue == "f" )
      onMessage( (const SecurityStatus&)message, sessionID );
    else
    if( msgTypeValue == "g" )
      onMessage( (const TradingSessionStatusRequest&)message, sessionID );
    else
    if( msgTypeValue == "h" )
      onMessage( (const TradingSessionStatus&)message, sessionID );
    else
    if( msgTypeValue == "i" )
      onMessage( (const MassQuote&)message, sessionID );
    else
    if( msgTypeValue == "j" )
      onMessage( (const BusinessMessageReject&)message, sessionID );
    else
    if( msgTypeValue == "k" )
      onMessage( (const BidRequest&)message, sessionID );
    else
    if( msgTypeValue == "l" )
      onMessage( (const BidResponse&)message, sessionID );
    else
    if( msgTypeValue == "m" )
      onMessage( (const ListStrikePrice&)message, sessionID );
    else
    if( msgTypeValue == "o" )
      onMessage( (const RegistrationInstructions&)message, sessionID );
    else
    if( msgTypeValue == "p" )
      onMessage( (const RegistrationInstructionsResponse&)message, sessionID );
    else
    if( msgTypeValue == "q" )
      onMessage( (const OrderMassCancelRequest&)message, sessionID );
    else
    if( msgTypeValue == "r" )
      onMessage( (const OrderMassCancelReport&)message, sessionID );
    else
    if( msgTypeValue == "s" )
      onMessage( (const NewOrderCross&)message, sessionID );
    else
    if( msgTypeValue == "t" )
      onMessage( (const CrossOrderCancelReplaceRequest&)message, sessionID );
    else
    if( msgTypeValue == "u" )
      onMessage( (const CrossOrderCancelRequest&)message, sessionID );
    else
    if( msgTypeValue == "v" )
      onMessage( (const SecurityTypeRequest&)message, sessionID );
    else
    if( msgTypeValue == "w" )
      onMessage( (const SecurityTypes&)message, sessionID );
    else
    if( msgTypeValue == "x" )
      onMessage( (const SecurityListRequest&)message, sessionID );
    else
    if( msgTypeValue == "y" )
      onMessage( (const SecurityList&)message, sessionID );
    else
    if( msgTypeValue == "z" )
      onMessage( (const DerivativeSecurityListRequest&)message, sessionID );
    else
    if( msgTypeValue == "AA" )
      onMessage( (const DerivativeSecurityList&)message, sessionID );
    else
    if( msgTypeValue == "AB" )
      onMessage( (const NewOrderMultileg&)message, sessionID );
    else
    if( msgTypeValue == "AC" )
      onMessage( (const MultilegOrderCancelReplace&)message, sessionID );
    else
    if( msgTypeValue == "AD" )
      onMessage( (const TradeCaptureReportRequest&)message, sessionID );
    else
    if( msgTypeValue == "AE" )
      onMessage( (const TradeCaptureReport&)message, sessionID );
    else
    if( msgTypeValue == "AF" )
      onMessage( (const OrderMassStatusRequest&)message, sessionID );
    else
    if( msgTypeValue == "AG" )
      onMessage( (const QuoteRequestReject&)message, sessionID );
    else
    if( msgTypeValue == "AH" )
      onMessage( (const RFQRequest&)message, sessionID );
    else
    if( msgTypeValue == "AI" )
      onMessage( (const QuoteStatusReport&)message, sessionID );
    else
    if( msgTypeValue == "AJ" )
      onMessage( (const QuoteResponse&)message, sessionID );
    else
    if( msgTypeValue == "AK" )
      onMessage( (const Confirmation&)message, sessionID );
    else
    if( msgTypeValue == "AL" )
      onMessage( (const PositionMaintenanceRequest&)message, sessionID );
    else
    if( msgTypeValue == "AM" )
      onMessage( (const PositionMaintenanceReport&)message, sessionID );
    else
    if( msgTypeValue == "AN" )
      onMessage( (const RequestForPositions&)message, sessionID );
    else
    if( msgTypeValue == "AO" )
      onMessage( (const RequestForPositionsAck&)message, sessionID );
    else
    if( msgTypeValue == "AP" )
      onMessage( (const PositionReport&)message, sessionID );
    else
    if( msgTypeValue == "AQ" )
      onMessage( (const TradeCaptureReportRequestAck&)message, sessionID );
    else
    if( msgTypeValue == "AR" )
      onMessage( (const TradeCaptureReportAck&)message, sessionID );
    else
    if( msgTypeValue == "AS" )
      onMessage( (const AllocationReport&)message, sessionID );
    else
    if( msgTypeValue == "AT" )
      onMessage( (const AllocationReportAck&)message, sessionID );
    else
    if( msgTypeValue == "AU" )
      onMessage( (const ConfirmationAck&)message, sessionID );
    else
    if( msgTypeValue == "AV" )
      onMessage( (const SettlementInstructionRequest&)message, sessionID );
    else
    if( msgTypeValue == "AW" )
      onMessage( (const AssignmentReport&)message, sessionID );
    else
    if( msgTypeValue == "AX" )
      onMessage( (const CollateralRequest&)message, sessionID );
    else
    if( msgTypeValue == "AY" )
      onMessage( (const CollateralAssignment&)message, sessionID );
    else
    if( msgTypeValue == "AZ" )
      onMessage( (const CollateralResponse&)message, sessionID );
    else
    if( msgTypeValue == "BA" )
      onMessage( (const CollateralReport&)message, sessionID );
    else
    if( msgTypeValue == "BB" )
      onMessage( (const CollateralInquiry&)message, sessionID );
    else
    if( msgTypeValue == "BC" )
      onMessage( (const NetworkCounterpartySystemStatusRequest&)message, sessionID );
    else
    if( msgTypeValue == "BD" )
      onMessage( (const NetworkCounterpartySystemStatusResponse&)message, sessionID );
    else
    if( msgTypeValue == "BE" )
      onMessage( (const UserRequest&)message, sessionID );
    else
    if( msgTypeValue == "BF" )
      onMessage( (const UserResponse&)message, sessionID );
    else
    if( msgTypeValue == "BG" )
      onMessage( (const CollateralInquiryAck&)message, sessionID );
    else
    if( msgTypeValue == "BH" )
      onMessage( (const ConfirmationRequest&)message, sessionID );
    else
    if( msgTypeValue == "BO" )
      onMessage( (const ContraryIntentionReport&)message, sessionID );
    else
    if( msgTypeValue == "BP" )
      onMessage( (const SecurityDefinitionUpdateReport&)message, sessionID );
    else
    if( msgTypeValue == "BK" )
      onMessage( (const SecurityListUpdateReport&)message, sessionID );
    else
    if( msgTypeValue == "BL" )
      onMessage( (const AdjustedPositionReport&)message, sessionID );
    else
    if( msgTypeValue == "BM" )
      onMessage( (const AllocationInstructionAlert&)message, sessionID );
    else
    if( msgTypeValue == "BN" )
      onMessage( (const ExecutionAcknowledgement&)message, sessionID );
    else
    if( msgTypeValue == "BJ" )
      onMessage( (const TradingSessionList&)message, sessionID );
    else
    if( msgTypeValue == "BI" )
      onMessage( (const TradingSessionListRequest&)message, sessionID );
    else onMessage( message, sessionID );
  }